

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.c
# Opt level: O0

double b2d(Bigint *a,int *e)

{
  int iVar1;
  uint32 x;
  char cVar2;
  int iVar3;
  uint32 *puVar4;
  byte bVar5;
  uint local_4c;
  uint local_48;
  uint local_44;
  uint local_40;
  uint uStack_3c;
  U d;
  int k;
  uint32 z;
  uint32 y;
  uint32 w;
  uint32 *xa0;
  uint32 *xa;
  int *e_local;
  Bigint *a_local;
  
  puVar4 = a->x;
  iVar1 = a->wds;
  xa0 = puVar4 + (long)iVar1 + -1;
  x = puVar4[(long)iVar1 + -1];
  iVar3 = hi0bits(x);
  *e = 0x20 - iVar3;
  if (iVar3 < 0xb) {
    cVar2 = (char)iVar3;
    uStack_3c = x >> (0xbU - cVar2 & 0x1f) | 0x3ff00000;
    if (puVar4 < xa0) {
      local_44 = puVar4[(long)iVar1 + -2];
    }
    else {
      local_44 = 0;
    }
    local_40 = x << (cVar2 + 0x15U & 0x1f) | local_44 >> (0xbU - cVar2 & 0x1f);
  }
  else {
    if (puVar4 < xa0) {
      xa0 = puVar4 + (long)iVar1 + -2;
      local_48 = puVar4[(long)iVar1 + -2];
    }
    else {
      local_48 = 0;
    }
    if (iVar3 + -0xb == 0) {
      uStack_3c = x | 0x3ff00000;
      local_40 = local_48;
    }
    else {
      bVar5 = (byte)(iVar3 + -0xb);
      uStack_3c = x << (bVar5 & 0x1f) | 0x3ff00000 | local_48 >> (0x20 - bVar5 & 0x1f);
      if (puVar4 < xa0) {
        local_4c = xa0[-1];
      }
      else {
        local_4c = 0;
      }
      local_40 = local_48 << (bVar5 & 0x1f) | local_4c >> (0x20 - bVar5 & 0x1f);
    }
  }
  return (double)CONCAT44(uStack_3c,local_40);
}

Assistant:

static double
b2d(Bigint *a, int *e)
{
    ULong *xa, *xa0, w, y, z;
    int k;
    U d;

    xa0 = a->x;
    xa = xa0 + a->wds;
    y = *--xa;
#ifdef DEBUG
    if (!y) Bug("zero y in b2d");
#endif
    k = hi0bits(y);
    *e = 32 - k;
    if (k < Ebits) {
        word0(&d) = Exp_1 | y >> (Ebits - k);
        w = xa > xa0 ? *--xa : 0;
        word1(&d) = y << ((32-Ebits) + k) | w >> (Ebits - k);
        goto ret_d;
    }
    z = xa > xa0 ? *--xa : 0;
    if (k -= Ebits) {
        word0(&d) = Exp_1 | y << k | z >> (32 - k);
        y = xa > xa0 ? *--xa : 0;
        word1(&d) = z << k | y >> (32 - k);
    }
    else {
        word0(&d) = Exp_1 | y;
        word1(&d) = z;
    }
  ret_d:
    return dval(&d);
}